

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O1

uint64_t __thiscall
duckdb_jaro_winkler::common::BitvectorHashmap::lookup(BitvectorHashmap *this,uint64_t key)

{
  long lVar1;
  uint uVar2;
  ulong uVar4;
  ulong uVar5;
  ulong uVar3;
  
  uVar2 = (uint)key & 0x7f;
  uVar3 = (ulong)uVar2;
  uVar4 = (ulong)(uVar2 << 4);
  if ((*(long *)((long)&(this->m_map)._M_elems[0].value + uVar4) != 0) &&
     (*(uint64_t *)((long)&(this->m_map)._M_elems[0].key + uVar4) != key)) {
    uVar2 = (uint)key * 6 + 1 & 0x7f;
    uVar5 = (ulong)(uVar2 << 4);
    lVar1 = *(long *)((long)&(this->m_map)._M_elems[0].value + uVar5);
    uVar4 = key;
    while ((uVar3 = (ulong)uVar2, lVar1 != 0 &&
           (*(uint64_t *)((long)&(this->m_map)._M_elems[0].key + uVar5) != key))) {
      uVar4 = uVar4 >> 5;
      uVar2 = uVar2 * 5 + (int)uVar4 + 1 & 0x7f;
      uVar5 = (ulong)(uVar2 << 4);
      lVar1 = *(long *)((long)&(this->m_map)._M_elems[0].value + uVar5);
    }
  }
  return uVar3;
}

Assistant:

uint64_t lookup(uint64_t key) const
    {
        uint64_t i = key % 128;

        if (!m_map[i].value || m_map[i].key == key) {
            return i;
        }

        uint64_t perturb = key;
        while (true) {
            i = ((i * 5) + perturb + 1) % 128;
            if (!m_map[i].value || m_map[i].key == key) {
                return i;
            }

            perturb >>= 5;
        }
    }